

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalMap.c
# Opt level: O2

Gia_Man_t * Gia_ManInsertWin(Gia_Man_t *p,Vec_Int_t *vOuts,Gia_Man_t *pWin)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  Gia_Man_t *pGVar7;
  int iVar8;
  Vec_Int_t *vPis;
  Vec_Int_t *vPos;
  Vec_Int_t *vAnds;
  Vec_Int_t *local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  Gia_ManPrepareWin(p,vOuts,&local_48,&local_40,&local_38,0);
  p_00 = Gia_ManStart((p->nObjs - local_38->nSize) + pWin->nObjs +
                      ~(pWin->vCos->nSize + pWin->vCis->nSize));
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  p->pObjs->Value = 0;
  for (iVar8 = 0; iVar8 < p->vCis->nSize; iVar8 = iVar8 + 1) {
    pGVar5 = Gia_ManCi(p,iVar8);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar5->Value = uVar1;
  }
  pWin->pObjs->Value = 0;
  for (iVar8 = 0; iVar8 < pWin->vCis->nSize; iVar8 = iVar8 + 1) {
    pGVar5 = Gia_ManCi(pWin,iVar8);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    iVar2 = Vec_IntEntry(local_48,iVar8);
    pGVar6 = Gia_ManObj(p,iVar2);
    pGVar5->Value = pGVar6->Value;
  }
  Gia_ManHashAlloc(p_00);
  for (iVar8 = 0; iVar8 < pWin->nObjs; iVar8 = iVar8 + 1) {
    pGVar5 = Gia_ManObj(pWin,iVar8);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
      iVar2 = Gia_ObjFanin0Copy(pGVar5);
      iVar3 = Gia_ObjFanin1Copy(pGVar5);
      uVar1 = Gia_ManHashAnd(p_00,iVar2,iVar3);
      pGVar5->Value = uVar1;
    }
  }
  for (iVar8 = 0; iVar8 < pWin->vCos->nSize; iVar8 = iVar8 + 1) {
    pGVar5 = Gia_ManCo(pWin,iVar8);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ObjFanin0Copy(pGVar5);
    iVar2 = Vec_IntEntry(local_40,iVar8);
    pGVar5 = Gia_ManObj(p,iVar2);
    pGVar5->Value = uVar1;
  }
  for (iVar8 = 0; iVar8 < p->nObjs; iVar8 = iVar8 + 1) {
    pGVar5 = Gia_ManObj(p,iVar8);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
      iVar2 = Gia_ObjIsTravIdCurrentId(p,iVar8);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjFanin0Copy(pGVar5);
        iVar3 = Gia_ObjFanin1Copy(pGVar5);
        uVar1 = Gia_ManHashAnd(p_00,iVar2,iVar3);
        pGVar5->Value = uVar1;
      }
    }
  }
  for (iVar8 = 0; iVar8 < p->vCos->nSize; iVar8 = iVar8 + 1) {
    pGVar5 = Gia_ManCo(p,iVar8);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjFanin0Copy(pGVar5);
    Gia_ManAppendCo(p_00,iVar2);
  }
  Gia_ManHashStop(p_00);
  Vec_IntFree(local_48);
  Vec_IntFree(local_40);
  Vec_IntFree(local_38);
  pGVar7 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar7;
}

Assistant:

Gia_Man_t * Gia_ManInsertWin( Gia_Man_t * p, Vec_Int_t * vOuts, Gia_Man_t * pWin )
{
    Vec_Int_t * vPos, * vPis, * vAnds;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManPrepareWin( p, vOuts, &vPis, &vPos, &vAnds, 0 );
    // create AIG
    pNew = Gia_ManStart( Gia_ManObjNum(p) - Vec_IntSize(vAnds) + Gia_ManAndNum(pWin) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // inputs
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManConst0(pWin)->Value = 0;
    Gia_ManForEachCi( pWin, pObj, i )
        pObj->Value = Gia_ManObj(p, Vec_IntEntry(vPis, i))->Value;
    // internal nodes
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachAnd( pWin, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( pWin, pObj, i )
        Gia_ManObj( p, Vec_IntEntry(vPos, i) )->Value = Gia_ObjFanin0Copy(pObj);
    Gia_ManForEachAnd( p, pObj, i )
        if ( !Gia_ObjIsTravIdCurrentId(p, i) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    // cleanup
    Vec_IntFree( vPis );
    Vec_IntFree( vPos );
    Vec_IntFree( vAnds );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}